

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::ParsedIR::set_member_name
          (ParsedIR *this,TypeID id,uint32_t index,string *name)

{
  mapped_type *pmVar1;
  bool bVar2;
  Vector<Decoration> *this_00;
  unsigned_long *puVar3;
  Decoration *this_01;
  value_type *__x;
  undefined1 local_4c [28];
  mapped_type *local_30;
  mapped_type *m;
  string *name_local;
  ParsedIR *pPStack_18;
  uint32_t index_local;
  ParsedIR *this_local;
  TypeID id_local;
  
  m = (mapped_type *)name;
  name_local._4_4_ = index;
  pPStack_18 = this;
  this_local._4_4_ = id.id;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID<(diligent_spirv_cross::Types)1>
            ((TypedID<(diligent_spirv_cross::Types)0> *)(local_4c + 0x18),
             (TypedID<(diligent_spirv_cross::Types)1> *)((long)&this_local + 4));
  local_30 = ::std::
             unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
             ::operator[](&this->meta,(key_type *)(local_4c + 0x18));
  this_00 = &local_30->members;
  local_4c._12_8_ =
       VectorView<diligent_spirv_cross::Meta::Decoration>::size
                 (&(local_30->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>);
  local_4c._4_8_ = (ulong)name_local._4_4_ + 1;
  puVar3 = ::std::max<unsigned_long>
                     ((unsigned_long *)(local_4c + 0xc),(unsigned_long *)(local_4c + 4));
  SmallVector<diligent_spirv_cross::Meta::Decoration,_0UL>::resize(this_00,*puVar3);
  pmVar1 = m;
  this_01 = VectorView<diligent_spirv_cross::Meta::Decoration>::operator[]
                      (&(local_30->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>
                       ,(ulong)name_local._4_4_);
  ::std::__cxx11::string::operator=((string *)this_01,(string *)pmVar1);
  bVar2 = is_valid_identifier((string *)m);
  if ((!bVar2) || (bVar2 = is_reserved_identifier((string *)m,true,false), bVar2)) {
    local_4c._0_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
             &this->meta_needing_name_fixup,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_4c,__x);
  }
  return;
}

Assistant:

void ParsedIR::set_member_name(TypeID id, uint32_t index, const string &name)
{
	auto &m = meta[id];
	m.members.resize(max(m.members.size(), size_t(index) + 1));
	m.members[index].alias = name;
	if (!is_valid_identifier(name) || is_reserved_identifier(name, true, false))
		meta_needing_name_fixup.insert(id);
}